

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verstring.c
# Opt level: O3

void ssh_verstring_handle_input(BinaryPacketProtocol *bpp)

{
  size_t *psVar1;
  byte *pbVar2;
  size_t *s;
  LogContext *pLVar3;
  PacketQueueNode *pPVar4;
  IdempotentCallback *pIVar5;
  int iVar6;
  size_t sVar7;
  void *pvVar8;
  char *pcVar9;
  size_t sVar10;
  toplevel_callback_fn_t p_Var11;
  char *pcVar12;
  _func_PktIn_ptr_PacketQueueBase_ptr_PacketQueueNode_ptr__Bool *p_Var13;
  IdempotentCallback *pIVar14;
  void *pvVar15;
  strbuf *buf;
  ptrlen pVar16;
  
  s = &bpp[-1].in_pq.pqb.end.formal_size;
  iVar6 = (int)bpp[-1].in_pq.pqb.end.formal_size;
  if (iVar6 < 0x10b) {
    if (iVar6 == 0) {
      if (*(char *)&bpp[-1].out_pq.pqb.end.prev == '\x01') {
        ssh_verstring_send((ssh_verstring_state *)s);
      }
      bpp[-1].remote_bugs = 0;
      goto LAB_0012f575;
    }
    if (iVar6 == 0xfa) {
      while( true ) {
        pIVar14 = (IdempotentCallback *)bufchain_size(bpp->in_raw);
        pIVar5 = bpp[-1].in_pq.pqb.ic;
        if (pIVar14 < pIVar5) break;
        pvVar15 = (void *)((long)&bpp[-1].out_pq.pqb.end.formal_size + 4);
        bufchain_fetch(bpp->in_raw,pvVar15,(size_t)pIVar5);
        pIVar5 = bpp[-1].in_pq.pqb.ic;
        iVar6 = bcmp(pvVar15,(void *)bpp[-1].in_pq.pqb.total_size,(size_t)pIVar5);
        if (iVar6 == 0) {
          bufchain_consume(bpp->in_raw,(size_t)pIVar5);
          ssh_check_frozen(bpp->ssh);
          *(undefined1 *)((long)&bpp[-1].out_pq.pqb.end.prev + 1) = 1;
          BinarySink_put_data((BinarySink *)(*(long *)&bpp[-1].ic_in_raw.queued + 0x18),
                              (void *)bpp[-1].in_pq.pqb.total_size,(size_t)bpp[-1].in_pq.pqb.ic);
          bpp[-1].remote_bugs = 0;
          goto LAB_0012ec99;
        }
        while( true ) {
          *(undefined4 *)s = 0x10b;
LAB_0012f64e:
          sVar7 = bufchain_size(bpp->in_raw);
          if (sVar7 == 0) goto LAB_0012f605;
          pVar16 = bufchain_prefix(bpp->in_raw);
          pvVar15 = memchr(pVar16.ptr,10,pVar16.len);
          if (pvVar15 != (void *)0x0) break;
          bufchain_consume(bpp->in_raw,pVar16.len);
          ssh_check_frozen(bpp->ssh);
        }
        bufchain_consume(bpp->in_raw,(long)pvVar15 + (1 - (long)pVar16.ptr));
        ssh_check_frozen(bpp->ssh);
LAB_0012f575:
        *(undefined4 *)s = 0xfa;
      }
LAB_0012f605:
      if (bpp->input_eof == false) {
        return;
      }
      ssh_remote_error(bpp->ssh,"Remote side unexpectedly closed network connection");
      return;
    }
  }
  else {
    if (iVar6 == 0x10b) goto LAB_0012f64e;
    if (iVar6 == 0x127) goto LAB_0012ec1e;
  }
  *(undefined4 *)s = 0;
  return;
  while( true ) {
    pVar16 = bufchain_prefix(bpp->in_raw);
    pvVar15 = pVar16.ptr;
    pvVar8 = memchr(pvVar15,10,pVar16.len);
    sVar7 = (long)pvVar8 + (1 - (long)pvVar15);
    if (pvVar8 == (void *)0x0) {
      sVar7 = pVar16.len;
    }
    pVar16.len = sVar7;
    pVar16.ptr = pvVar15;
    BinarySink_put_datapl((BinarySink *)(*(long *)&bpp[-1].ic_in_raw.queued + 0x18),pVar16);
    bufchain_consume(bpp->in_raw,sVar7);
    ssh_check_frozen(bpp->ssh);
    buf = *(strbuf **)&bpp[-1].ic_in_raw.queued;
    pcVar9 = buf->s;
    sVar7 = buf->len;
    if (pcVar9[sVar7 - 1] == '\n') break;
LAB_0012ec99:
    *(undefined4 *)s = 0x127;
LAB_0012ec1e:
    sVar7 = bufchain_size(bpp->in_raw);
    if (sVar7 == 0) goto LAB_0012f605;
  }
  if (sVar7 != 0) {
    do {
      pcVar9 = buf->s;
      if ((pcVar9[sVar7 - 1] != '\r') && (pcVar9[sVar7 - 1] != '\n')) goto LAB_0012ecd6;
      strbuf_shrink_by(buf,1);
      buf = *(strbuf **)&bpp[-1].ic_in_raw.queued;
      sVar7 = buf->len;
    } while (sVar7 != 0);
    pcVar9 = buf->s;
  }
LAB_0012ecd6:
  pLVar3 = bpp->logctx;
  pcVar9 = dupprintf("Remote version: %s",pcVar9);
  logevent_and_free(pLVar3,pcVar9);
  pcVar12 = (char *)((long)&(bpp[-1].in_pq.pqb.ic)->fn + **(long **)&bpp[-1].ic_in_raw.queued);
  sVar10 = strcspn(pcVar12,"-");
  p_Var11 = (toplevel_callback_fn_t)dupprintf("%.*s",sVar10 & 0xffffffff,pcVar12);
  bpp[-1].ic_out_pq.fn = p_Var11;
  pcVar9 = pcVar12 + (int)sVar10;
  bpp[-1].ic_out_pq.ctx = pcVar9;
  if (pcVar12[(int)sVar10] != '\0') {
    if (pcVar12[(int)sVar10] != '-') {
      __assert_fail("*s->softwareversion == \'-\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/verstring.c"
                    ,0x14a,"void ssh_verstring_handle_input(BinaryPacketProtocol *)");
    }
    pcVar9 = pcVar9 + 1;
    bpp[-1].ic_out_pq.ctx = pcVar9;
  }
  *(undefined4 *)&bpp[-1].out_pq.pqb.end.formal_size = 0;
  iVar6 = conf_get_int(*(Conf **)&bpp[-1].in_pq.pqb.end.on_free_queue,0xb1);
  if ((iVar6 == 0) ||
     ((iVar6 = conf_get_int(*(Conf **)&bpp[-1].in_pq.pqb.end.on_free_queue,0xb1), iVar6 == 2 &&
      (((((iVar6 = strcmp(pcVar9,"1.2.18"), iVar6 == 0 ||
          (iVar6 = strcmp(pcVar9,"1.2.19"), iVar6 == 0)) ||
         (iVar6 = strcmp(pcVar9,"1.2.20"), iVar6 == 0)) ||
        ((iVar6 = strcmp(pcVar9,"1.2.21"), iVar6 == 0 ||
         (iVar6 = strcmp(pcVar9,"1.2.22"), iVar6 == 0)))) ||
       ((iVar6 = strcmp(pcVar9,"Cisco-1.25"), iVar6 == 0 ||
        ((iVar6 = strcmp(pcVar9,"OSU_1.4alpha3"), iVar6 == 0 ||
         (iVar6 = strcmp(pcVar9,"OSU_1.5alpha4"), iVar6 == 0)))))))))) {
    psVar1 = &bpp[-1].out_pq.pqb.end.formal_size;
    *(byte *)psVar1 = (byte)*psVar1 | 1;
    pLVar3 = bpp->logctx;
    pcVar12 = dupprintf("We believe remote version has SSH-1 ignore bug");
    logevent_and_free(pLVar3,pcVar12);
  }
  iVar6 = conf_get_int(*(Conf **)&bpp[-1].in_pq.pqb.end.on_free_queue,0xb2);
  if ((iVar6 == 0) ||
     ((iVar6 = conf_get_int(*(Conf **)&bpp[-1].in_pq.pqb.end.on_free_queue,0xb2), iVar6 == 2 &&
      ((iVar6 = strcmp(pcVar9,"Cisco-1.25"), iVar6 == 0 ||
       (iVar6 = strcmp(pcVar9,"OSU_1.4alpha3"), iVar6 == 0)))))) {
    psVar1 = &bpp[-1].out_pq.pqb.end.formal_size;
    *(byte *)psVar1 = (byte)*psVar1 | 4;
    pLVar3 = bpp->logctx;
    pcVar12 = dupprintf("We believe remote version needs a plain SSH-1 password");
    logevent_and_free(pLVar3,pcVar12);
  }
  iVar6 = conf_get_int(*(Conf **)&bpp[-1].in_pq.pqb.end.on_free_queue,0xb3);
  if ((iVar6 == 0) ||
     ((iVar6 = conf_get_int(*(Conf **)&bpp[-1].in_pq.pqb.end.on_free_queue,0xb3), iVar6 == 2 &&
      (iVar6 = strcmp(pcVar9,"Cisco-1.25"), iVar6 == 0)))) {
    psVar1 = &bpp[-1].out_pq.pqb.end.formal_size;
    *(byte *)psVar1 = (byte)*psVar1 | 8;
    pLVar3 = bpp->logctx;
    pcVar12 = dupprintf("We believe remote version can\'t handle SSH-1 RSA authentication");
    logevent_and_free(pLVar3,pcVar12);
  }
  iVar6 = conf_get_int(*(Conf **)&bpp[-1].in_pq.pqb.end.on_free_queue,0xb4);
  if ((iVar6 == 0) ||
     (((iVar6 = conf_get_int(*(Conf **)&bpp[-1].in_pq.pqb.end.on_free_queue,0xb4), iVar6 == 2 &&
       (iVar6 = wc_match("* VShell",pcVar9), iVar6 == 0)) &&
      (((iVar6 = wc_match("2.1.0*",pcVar9), iVar6 != 0 ||
        (((iVar6 = wc_match("2.0.*",pcVar9), iVar6 != 0 ||
          (iVar6 = wc_match("2.2.0*",pcVar9), iVar6 != 0)) ||
         (iVar6 = wc_match("2.3.0*",pcVar9), iVar6 != 0)))) ||
       (iVar6 = wc_match("2.1 *",pcVar9), iVar6 != 0)))))) {
    psVar1 = &bpp[-1].out_pq.pqb.end.formal_size;
    *(byte *)psVar1 = (byte)*psVar1 | 2;
    pLVar3 = bpp->logctx;
    pcVar12 = dupprintf("We believe remote version has SSH-2 HMAC bug");
    logevent_and_free(pLVar3,pcVar12);
  }
  iVar6 = conf_get_int(*(Conf **)&bpp[-1].in_pq.pqb.end.on_free_queue,0xb5);
  if ((iVar6 == 0) ||
     (((iVar6 = conf_get_int(*(Conf **)&bpp[-1].in_pq.pqb.end.on_free_queue,0xb5), iVar6 == 2 &&
       (iVar6 = wc_match("* VShell",pcVar9), iVar6 == 0)) &&
      ((iVar6 = wc_match("2.0.0*",pcVar9), iVar6 != 0 ||
       (iVar6 = wc_match("2.0.10*",pcVar9), iVar6 != 0)))))) {
    psVar1 = &bpp[-1].out_pq.pqb.end.formal_size;
    *(byte *)psVar1 = (byte)*psVar1 | 0x20;
    pLVar3 = bpp->logctx;
    pcVar12 = dupprintf("We believe remote version has SSH-2 key-derivation bug");
    logevent_and_free(pLVar3,pcVar12);
  }
  iVar6 = conf_get_int(*(Conf **)&bpp[-1].in_pq.pqb.end.on_free_queue,0xb6);
  if ((iVar6 == 0) ||
     ((iVar6 = conf_get_int(*(Conf **)&bpp[-1].in_pq.pqb.end.on_free_queue,0xb6), iVar6 == 2 &&
      (((iVar6 = wc_match("OpenSSH_2.[5-9]*",pcVar9), iVar6 != 0 ||
        (iVar6 = wc_match("OpenSSH_3.[0-2]*",pcVar9), iVar6 != 0)) ||
       ((iVar6 = wc_match("mod_sftp/0.[0-8]*",pcVar9), iVar6 != 0 ||
        (iVar6 = wc_match("mod_sftp/0.9.[0-8]",pcVar9), iVar6 != 0)))))))) {
    psVar1 = &bpp[-1].out_pq.pqb.end.formal_size;
    *(byte *)psVar1 = (byte)*psVar1 | 0x10;
    pLVar3 = bpp->logctx;
    pcVar12 = dupprintf("We believe remote version has SSH-2 RSA padding bug");
    logevent_and_free(pLVar3,pcVar12);
  }
  iVar6 = conf_get_int(*(Conf **)&bpp[-1].in_pq.pqb.end.on_free_queue,0xb7);
  if ((iVar6 == 0) ||
     ((iVar6 = conf_get_int(*(Conf **)&bpp[-1].in_pq.pqb.end.on_free_queue,0xb7), iVar6 == 2 &&
      (iVar6 = wc_match("OpenSSH_2.[0-2]*",pcVar9), iVar6 != 0)))) {
    psVar1 = &bpp[-1].out_pq.pqb.end.formal_size;
    *(byte *)psVar1 = (byte)*psVar1 | 0x80;
    pLVar3 = bpp->logctx;
    pcVar12 = dupprintf("We believe remote version has SSH-2 public-key-session-ID bug");
    logevent_and_free(pLVar3,pcVar12);
  }
  iVar6 = conf_get_int(*(Conf **)&bpp[-1].in_pq.pqb.end.on_free_queue,0xb8);
  if ((iVar6 == 0) ||
     ((iVar6 = conf_get_int(*(Conf **)&bpp[-1].in_pq.pqb.end.on_free_queue,0xb8), iVar6 == 2 &&
      ((((iVar6 = wc_match("DigiSSH_2.0",pcVar9), iVar6 != 0 ||
         (iVar6 = wc_match("OpenSSH_2.[0-4]*",pcVar9), iVar6 != 0)) ||
        (iVar6 = wc_match("OpenSSH_2.5.[0-3]*",pcVar9), iVar6 != 0)) ||
       (((iVar6 = wc_match("Sun_SSH_1.0",pcVar9), iVar6 != 0 ||
         (iVar6 = wc_match("Sun_SSH_1.0.1",pcVar9), iVar6 != 0)) ||
        (iVar6 = wc_match("WeOnlyDo-*",pcVar9), iVar6 != 0)))))))) {
    psVar1 = &bpp[-1].out_pq.pqb.end.formal_size;
    *(byte *)psVar1 = (byte)*psVar1 | 0x40;
    pLVar3 = bpp->logctx;
    pcVar12 = dupprintf("We believe remote version has SSH-2 rekey bug");
    logevent_and_free(pLVar3,pcVar12);
  }
  iVar6 = conf_get_int(*(Conf **)&bpp[-1].in_pq.pqb.end.on_free_queue,0xb9);
  if ((iVar6 == 0) ||
     ((iVar6 = conf_get_int(*(Conf **)&bpp[-1].in_pq.pqb.end.on_free_queue,0xb9), iVar6 == 2 &&
      ((iVar6 = wc_match("1.36_sshlib GlobalSCAPE",pcVar9), iVar6 != 0 ||
       (iVar6 = wc_match("1.36 sshlib: GlobalScape",pcVar9), iVar6 != 0)))))) {
    pbVar2 = (byte *)((long)&bpp[-1].out_pq.pqb.end.formal_size + 1);
    *pbVar2 = *pbVar2 | 1;
    pLVar3 = bpp->logctx;
    pcVar12 = dupprintf("We believe remote version ignores SSH-2 maximum packet size");
    logevent_and_free(pLVar3,pcVar12);
  }
  iVar6 = conf_get_int(*(Conf **)&bpp[-1].in_pq.pqb.end.on_free_queue,0xba);
  if (iVar6 == 0) {
    pbVar2 = (byte *)((long)&bpp[-1].out_pq.pqb.end.formal_size + 1);
    *pbVar2 = *pbVar2 | 2;
    pLVar3 = bpp->logctx;
    pcVar12 = dupprintf("We believe remote version has SSH-2 ignore bug");
    logevent_and_free(pLVar3,pcVar12);
  }
  iVar6 = conf_get_int(*(Conf **)&bpp[-1].in_pq.pqb.end.on_free_queue,0xbb);
  if ((iVar6 == 0) ||
     ((iVar6 = conf_get_int(*(Conf **)&bpp[-1].in_pq.pqb.end.on_free_queue,0xbb), iVar6 == 2 &&
      (iVar6 = wc_match("OpenSSH_2.[235]*",pcVar9), iVar6 != 0)))) {
    pbVar2 = (byte *)((long)&bpp[-1].out_pq.pqb.end.formal_size + 1);
    *pbVar2 = *pbVar2 | 0x10;
    pLVar3 = bpp->logctx;
    pcVar12 = dupprintf("We believe remote version has outdated SSH-2 GEX");
    logevent_and_free(pLVar3,pcVar12);
  }
  iVar6 = conf_get_int(*(Conf **)&bpp[-1].in_pq.pqb.end.on_free_queue,0xbc);
  if (iVar6 == 0) {
    pbVar2 = (byte *)((long)&bpp[-1].out_pq.pqb.end.formal_size + 1);
    *pbVar2 = *pbVar2 | 4;
    pLVar3 = bpp->logctx;
    pcVar12 = dupprintf("We believe remote version has winadj bug");
    logevent_and_free(pLVar3,pcVar12);
  }
  iVar6 = conf_get_int(*(Conf **)&bpp[-1].in_pq.pqb.end.on_free_queue,0xbd);
  if ((iVar6 == 0) ||
     ((iVar6 = conf_get_int(*(Conf **)&bpp[-1].in_pq.pqb.end.on_free_queue,0xbd), iVar6 == 2 &&
      ((((iVar6 = wc_match("OpenSSH_[2-5].*",pcVar9), iVar6 != 0 ||
         (iVar6 = wc_match("OpenSSH_6.[0-6]*",pcVar9), iVar6 != 0)) ||
        (iVar6 = wc_match("dropbear_0.[2-4][0-9]*",pcVar9), iVar6 != 0)) ||
       (iVar6 = wc_match("dropbear_0.5[01]*",pcVar9), iVar6 != 0)))))) {
    pbVar2 = (byte *)((long)&bpp[-1].out_pq.pqb.end.formal_size + 1);
    *pbVar2 = *pbVar2 | 8;
    pLVar3 = bpp->logctx;
    pcVar9 = dupprintf("We believe remote version has SSH-2 channel request bug");
    logevent_and_free(pLVar3,pcVar9);
  }
  iVar6 = ssh_versioncmp((char *)bpp[-1].in_pq.after,"1.99");
  if ((iVar6 < 0) || (iVar6 = ssh_versioncmp((char *)bpp[-1].ic_out_pq.fn,"1.99"), iVar6 < 0)) {
    iVar6 = ssh_versioncmp((char *)bpp[-1].in_pq.after,"2.0");
    if ((-1 < iVar6) || (iVar6 = ssh_versioncmp((char *)bpp[-1].ic_out_pq.fn,"2.0"), -1 < iVar6)) {
      iVar6 = ssh_versioncmp((char *)bpp[-1].in_pq.after,"1.99");
      pcVar9 = "SSH protocol version 1 required by our configuration but not provided by remote";
      if (-1 < iVar6) {
        pcVar9 = 
        "SSH protocol version 2 required by our configuration but remote only provides (old, insecure) SSH-1"
        ;
      }
      ssh_sw_abort(bpp->ssh,pcVar9);
      *(undefined4 *)&bpp[-1].in_pq.pqb.end.formal_size = 0;
      return;
    }
    *(undefined4 *)((long)&bpp[-1].out_pq.pqb.end.prev + 4) = 1;
    if ((*(char *)&bpp[-1].out_pq.pqb.end.prev == '\0') &&
       (iVar6 = ssh_versioncmp((char *)bpp[-1].in_pq.after,(char *)bpp[-1].ic_out_pq.fn), 0 < iVar6)
       ) {
      safefree(bpp[-1].in_pq.after);
      p_Var13 = (_func_PktIn_ptr_PacketQueueBase_ptr_PacketQueueNode_ptr__Bool *)
                dupstr((char *)bpp[-1].ic_out_pq.fn);
      bpp[-1].in_pq.after = p_Var13;
    }
  }
  else {
    *(undefined4 *)((long)&bpp[-1].out_pq.pqb.end.prev + 4) = 2;
  }
  pLVar3 = bpp->logctx;
  pcVar9 = dupprintf("Using SSH protocol version %d",
                     (ulong)*(uint *)((long)&bpp[-1].out_pq.pqb.end.prev + 4));
  logevent_and_free(pLVar3,pcVar9);
  if (*(char *)&bpp[-1].out_pq.pqb.end.prev == '\0') {
    ssh_verstring_send((ssh_verstring_state *)s);
  }
  pPVar4 = bpp[-1].out_pq.pqb.end.next;
  (*(code *)pPVar4->next)(pPVar4,*(undefined4 *)((long)&bpp[-1].out_pq.pqb.end.prev + 4));
  return;
}

Assistant:

void ssh_verstring_handle_input(BinaryPacketProtocol *bpp)
{
    struct ssh_verstring_state *s =
        container_of(bpp, struct ssh_verstring_state, bpp);

    crBegin(s->crState);

    /*
     * If we're sending our version string up front before seeing the
     * other side's, then do it now.
     */
    if (s->send_early)
        ssh_verstring_send(s);

    /*
     * Search for a line beginning with the protocol name prefix in
     * the input.
     */
    s->i = 0;
    while (1) {
        /*
         * Every time round this loop, we're at the start of a new
         * line, so look for the prefix.
         */
        BPP_WAITFOR(s->prefix_wanted.len);
        bufchain_fetch(s->bpp.in_raw, s->prefix, s->prefix_wanted.len);
        if (!memcmp(s->prefix, s->prefix_wanted.ptr, s->prefix_wanted.len)) {
            bufchain_consume(s->bpp.in_raw, s->prefix_wanted.len);
            ssh_check_frozen(s->bpp.ssh);
            break;
        }

        /*
         * If we didn't find it, consume data until we see a newline.
         */
        while (1) {
            ptrlen data;
            char *nl;

            /* Wait to receive at least 1 byte, but then consume more
             * than that if it's there. */
            BPP_WAITFOR(1);
            data = bufchain_prefix(s->bpp.in_raw);
            if ((nl = memchr(data.ptr, '\012', data.len)) != NULL) {
                bufchain_consume(s->bpp.in_raw, nl - (char *)data.ptr + 1);
                ssh_check_frozen(s->bpp.ssh);
                break;
            } else {
                bufchain_consume(s->bpp.in_raw, data.len);
                ssh_check_frozen(s->bpp.ssh);
            }
        }
    }

    s->found_prefix = true;

    /*
     * Copy the greeting line so far into vstring.
     */
    put_data(s->vstring, s->prefix_wanted.ptr, s->prefix_wanted.len);

    /*
     * Now read the rest of the greeting line.
     */
    s->i = 0;
    do {
        ptrlen data;
        char *nl;

        BPP_WAITFOR(1);
        data = bufchain_prefix(s->bpp.in_raw);
        if ((nl = memchr(data.ptr, '\012', data.len)) != NULL) {
            data.len = nl - (char *)data.ptr + 1;
        }

        put_datapl(s->vstring, data);
        bufchain_consume(s->bpp.in_raw, data.len);
        ssh_check_frozen(s->bpp.ssh);

    } while (s->vstring->s[s->vstring->len-1] != '\012');

    /*
     * Trim \r and \n from the version string, and replace them with
     * a NUL terminator.
     */
    while (s->vstring->len > 0 &&
           (s->vstring->s[s->vstring->len-1] == '\015' ||
            s->vstring->s[s->vstring->len-1] == '\012'))
        strbuf_shrink_by(s->vstring, 1);

    bpp_logevent("Remote version: %s", s->vstring->s);

    /*
     * Pick out the protocol version and software version. The former
     * goes in a separately allocated string, so that s->vstring
     * remains intact for later use in key exchange; the latter is the
     * tail of s->vstring, so it doesn't need to be allocated.
     */
    {
        const char *pv_start = s->vstring->s + s->prefix_wanted.len;
        int pv_len = strcspn(pv_start, "-");
        s->protoversion = dupprintf("%.*s", pv_len, pv_start);
        s->softwareversion = pv_start + pv_len;
        if (*s->softwareversion) {
            assert(*s->softwareversion == '-');
            s->softwareversion++;
        }
    }

    ssh_detect_bugs(s);

    /*
     * Figure out what actual SSH protocol version we're speaking.
     */
    if (ssh_version_includes_v2(s->our_protoversion) &&
        ssh_version_includes_v2(s->protoversion)) {
        /*
         * We're doing SSH-2.
         */
        s->major_protoversion = 2;
    } else if (ssh_version_includes_v1(s->our_protoversion) &&
               ssh_version_includes_v1(s->protoversion)) {
        /*
         * We're doing SSH-1.
         */
        s->major_protoversion = 1;

        /*
         * There are multiple minor versions of SSH-1, and the
         * protocol does not specify that the minimum of client
         * and server versions is used. So we must adjust our
         * outgoing protocol version to be no higher than that of
         * the other side.
         */
        if (!s->send_early &&
            ssh_versioncmp(s->our_protoversion, s->protoversion) > 0) {
            sfree(s->our_protoversion);
            s->our_protoversion = dupstr(s->protoversion);
        }
    } else {
        /*
         * Unable to agree on a major protocol version at all.
         */
        if (!ssh_version_includes_v2(s->our_protoversion)) {
            ssh_sw_abort(s->bpp.ssh,
                         "SSH protocol version 1 required by our "
                         "configuration but not provided by remote");
        } else {
            ssh_sw_abort(s->bpp.ssh,
                         "SSH protocol version 2 required by our "
                         "configuration but remote only provides "
                         "(old, insecure) SSH-1");
        }
        crStopV;
    }

    bpp_logevent("Using SSH protocol version %d", s->major_protoversion);

    if (!s->send_early) {
        /*
         * If we didn't send our version string early, construct and
         * send it now, because now we know what it is.
         */
        ssh_verstring_send(s);
    }

    /*
     * And we're done. Notify our receiver that we now know our
     * protocol version. This will cause it to disconnect us from the
     * input stream and ultimately free us, because our job is now
     * done.
     */
    s->receiver->got_ssh_version(s->receiver, s->major_protoversion);
    return;

  eof:
    ssh_remote_error(s->bpp.ssh,
                     "Remote side unexpectedly closed network connection");
    return;  /* avoid touching s now it's been freed */

    crFinishV;
}